

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_motion.c
# Opt level: O0

double fsnav_ins_motion_parse_double
                 (char *token,char *src,size_t len,double *range,double default_value)

{
  char *__nptr;
  double local_40;
  double val;
  char *cfg_ptr;
  double default_value_local;
  double *range_local;
  size_t len_local;
  char *src_local;
  char *token_local;
  
  __nptr = fsnav_locate_token(token,src,len,'=');
  if ((__nptr == (char *)0x0) ||
     ((local_40 = atof(__nptr), range != (double *)0x0 &&
      (((range[1] <= *range && *range != range[1] || (local_40 < *range)) || (range[1] < local_40)))
      ))) {
    local_40 = default_value;
  }
  return local_40;
}

Assistant:

double fsnav_ins_motion_parse_double(const char *token, char *src, const size_t len, double *range, const double default_value) {

	char   *cfg_ptr; // pointer to a substring
	double  val;     // value

	// ensure variable to be initialized
	val = default_value;
	// parse token from src
	cfg_ptr = fsnav_locate_token(token, src, len, '=');
	if (cfg_ptr != NULL)
		val = atof(cfg_ptr);
	// if not found or out of range, set to default
	if ( cfg_ptr == NULL || (range != NULL && (range[0] > range[1] || val < range[0] || range[1] < val)) )
		val = default_value;
	return val;

}